

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int simple_next_token(uint8_t **pp,BOOL no_line_terminator)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  int in_ESI;
  undefined8 *in_RDI;
  bool bVar5;
  uint32_t c;
  uint8_t *p;
  byte *local_20;
  
  pbVar4 = (byte *)*in_RDI;
LAB_00141dfa:
  do {
    local_20 = pbVar4;
    pbVar4 = local_20 + 1;
    uVar1 = (uint)*local_20;
    iVar2 = uVar1 - 9;
    switch(iVar2) {
    case 0:
    case 2:
    case 3:
    case 0x17:
      break;
    case 1:
    case 4:
      if (in_ESI != 0) {
        return 10;
      }
      break;
    default:
      iVar3 = lre_js_is_ident_first(0x141f7e);
      if (iVar3 == 0) {
        return uVar1;
      }
      if (uVar1 == 0x69) {
        if ((*pbVar4 == 0x6e) && (iVar3 = lre_js_is_ident_next(iVar2), iVar3 == 0)) {
          return -0x49;
        }
        if ((((*pbVar4 == 0x6d) && (local_20[2] == 0x70)) && (local_20[3] == 0x6f)) &&
           (((local_20[4] == 0x72 && (local_20[5] == 0x74)) &&
            (iVar2 = lre_js_is_ident_next(iVar2), iVar2 == 0)))) {
          *in_RDI = local_20 + 6;
          return -0x33;
        }
      }
      else {
        if (((uVar1 == 0x6f) && (*pbVar4 == 0x66)) &&
           (iVar3 = lre_js_is_ident_next(iVar2), iVar3 == 0)) {
          return -0x27;
        }
        if ((((uVar1 == 0x65) && (*pbVar4 == 0x78)) &&
            ((local_20[2] == 0x70 && ((local_20[3] == 0x6f && (local_20[4] == 0x72)))))) &&
           ((local_20[5] == 0x74 && (iVar3 = lre_js_is_ident_next(iVar2), iVar3 == 0)))) {
          *in_RDI = local_20 + 6;
          return -0x35;
        }
        if (((((uVar1 == 0x66) && (*pbVar4 == 0x75)) && (local_20[2] == 0x6e)) &&
            ((local_20[3] == 99 && (local_20[4] == 0x74)))) &&
           (((local_20[5] == 0x69 && ((local_20[6] == 0x6f && (local_20[7] == 0x6e)))) &&
            (iVar2 = lre_js_is_ident_next(iVar2), iVar2 == 0)))) {
          return -0x3b;
        }
      }
      return -0x7d;
    case 0x26:
      if (*pbVar4 == 0x2f) {
        local_20 = pbVar4;
        if (in_ESI != 0) {
          return 10;
        }
        while( true ) {
          bVar5 = false;
          if ((*local_20 != 0) && (bVar5 = false, *local_20 != 0xd)) {
            bVar5 = *local_20 != 10;
          }
          pbVar4 = local_20;
          if (!bVar5) break;
          local_20 = local_20 + 1;
        }
      }
      else {
        if (*pbVar4 != 0x2a) {
          return uVar1;
        }
        do {
          local_20 = pbVar4;
          pbVar4 = local_20 + 1;
          if (local_20[1] == 0) goto LAB_00141dfa;
          if (((*pbVar4 == 0xd) || (*pbVar4 == 10)) && (in_ESI != 0)) {
            return 10;
          }
        } while ((*pbVar4 != 0x2a) || (local_20[2] != 0x2f));
        pbVar4 = local_20 + 3;
      }
      break;
    case 0x34:
      if (*pbVar4 != 0x3e) {
        return uVar1;
      }
      return -0x5c;
    }
  } while( true );
}

Assistant:

static int simple_next_token(const uint8_t **pp, BOOL no_line_terminator)
{
    const uint8_t *p;
    uint32_t c;
    
    /* skip spaces and comments */
    p = *pp;
    for (;;) {
        switch(c = *p++) {
        case '\r':
        case '\n':
            if (no_line_terminator)
                return '\n';
            continue;
        case ' ':
        case '\t':
        case '\v':
        case '\f':
            continue;
        case '/':
            if (*p == '/') {
                if (no_line_terminator)
                    return '\n';
                while (*p && *p != '\r' && *p != '\n')
                    p++;
                continue;
            }
            if (*p == '*') {
                while (*++p) {
                    if ((*p == '\r' || *p == '\n') && no_line_terminator)
                        return '\n';
                    if (*p == '*' && p[1] == '/') {
                        p += 2;
                        break;
                    }
                }
                continue;
            }
            break;
        case '=':
            if (*p == '>')
                return TOK_ARROW;
            break;
        default:
            if (lre_js_is_ident_first(c)) {
                if (c == 'i') {
                    if (p[0] == 'n' && !lre_js_is_ident_next(p[1])) {
                        return TOK_IN;
                    }
                    if (p[0] == 'm' && p[1] == 'p' && p[2] == 'o' &&
                        p[3] == 'r' && p[4] == 't' &&
                        !lre_js_is_ident_next(p[5])) {
                        *pp = p + 5;
                        return TOK_IMPORT;
                    }
                } else if (c == 'o' && *p == 'f' && !lre_js_is_ident_next(p[1])) {
                    return TOK_OF;
                } else if (c == 'e' &&
                           p[0] == 'x' && p[1] == 'p' && p[2] == 'o' &&
                           p[3] == 'r' && p[4] == 't' &&
                           !lre_js_is_ident_next(p[5])) {
                    *pp = p + 5;
                    return TOK_EXPORT;
                } else if (c == 'f' && p[0] == 'u' && p[1] == 'n' &&
                         p[2] == 'c' && p[3] == 't' && p[4] == 'i' &&
                         p[5] == 'o' && p[6] == 'n' && !lre_js_is_ident_next(p[7])) {
                    return TOK_FUNCTION;
                }
                return TOK_IDENT;
            }
            break;
        }
        return c;
    }
}